

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O3

int mock_loader_impl_discover(loader_impl impl,loader_handle handle,context ctx)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  loader_impl_get();
  puVar2 = (undefined8 *)malloc(0x10);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = handle;
    puVar2[1] = 0;
  }
  uVar3 = context_scope(ctx);
  log_write_impl_va("metacall",0x1b1,"mock_loader_impl_discover",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                    ,0,"Mock module %p discovering",handle);
  if (puVar2 != (undefined8 *)0x0) {
    uVar4 = function_create("my_empty_func",0,puVar2,function_mock_singleton);
    uVar5 = function_signature(uVar4);
    uVar6 = loader_impl_type(impl,"Integer");
    signature_set_return(uVar5,uVar6);
    uVar5 = value_create_function(uVar4);
    uVar4 = function_name(uVar4);
    iVar1 = scope_define(uVar3,uVar4,uVar5);
    if (iVar1 != 0) goto LAB_0010304b;
  }
  puVar2 = (undefined8 *)malloc(0x10);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = handle;
    puVar2[1] = 0;
    uVar4 = function_create("two_doubles",2,puVar2,function_mock_singleton);
    uVar5 = function_signature(uVar4);
    uVar6 = loader_impl_type(impl,"Double");
    signature_set_return(uVar5,uVar6);
    uVar6 = loader_impl_type(impl,"Double");
    signature_set(uVar5,0,"first_parameter",uVar6);
    uVar6 = loader_impl_type(impl,"Double");
    signature_set(uVar5,1,"second_parameter",uVar6);
    uVar5 = value_create_function(uVar4);
    uVar4 = function_name(uVar4);
    iVar1 = scope_define(uVar3,uVar4,uVar5);
    if (iVar1 != 0) goto LAB_0010304b;
  }
  puVar2 = (undefined8 *)malloc(0x10);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = handle;
    puVar2[1] = 0;
    uVar4 = function_create("mixed_args",5,puVar2,function_mock_singleton);
    uVar5 = function_signature(uVar4);
    uVar6 = loader_impl_type(impl,"Char");
    signature_set_return(uVar5,uVar6);
    uVar6 = loader_impl_type(impl,"Char");
    signature_set(uVar5,0,"a_char",uVar6);
    uVar6 = loader_impl_type(impl,"Integer");
    signature_set(uVar5,1,"b_int",uVar6);
    uVar6 = loader_impl_type(impl,"Long");
    signature_set(uVar5,2,"c_long",uVar6);
    uVar6 = loader_impl_type(impl,"Double");
    signature_set(uVar5,3,"d_double",uVar6);
    uVar6 = loader_impl_type(impl,"Ptr");
    signature_set(uVar5,4,"e_ptr",uVar6);
    uVar5 = value_create_function(uVar4);
    uVar4 = function_name(uVar4);
    iVar1 = scope_define(uVar3,uVar4,uVar5);
    if (iVar1 != 0) goto LAB_0010304b;
  }
  puVar2 = (undefined8 *)malloc(0x10);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = handle;
    puVar2[1] = 0;
    uVar4 = function_create("new_args",1,puVar2,function_mock_singleton);
    uVar5 = function_signature(uVar4);
    uVar6 = loader_impl_type(impl,"String");
    signature_set_return(uVar5,uVar6);
    uVar6 = loader_impl_type(impl,"String");
    signature_set(uVar5,0,"a_str",uVar6);
    uVar5 = value_create_function(uVar4);
    uVar4 = function_name(uVar4);
    iVar1 = scope_define(uVar3,uVar4,uVar5);
    if (iVar1 != 0) goto LAB_0010304b;
  }
  puVar2 = (undefined8 *)malloc(0x10);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = handle;
    puVar2[1] = 0;
    uVar4 = function_create("two_str",2,puVar2,function_mock_singleton);
    uVar5 = function_signature(uVar4);
    uVar6 = loader_impl_type(impl,"String");
    signature_set_return(uVar5,uVar6);
    uVar6 = loader_impl_type(impl,"String");
    signature_set(uVar5,0,"a_str",uVar6);
    uVar6 = loader_impl_type(impl,"String");
    signature_set(uVar5,1,"b_str",uVar6);
    uVar5 = value_create_function(uVar4);
    uVar4 = function_name(uVar4);
    iVar1 = scope_define(uVar3,uVar4,uVar5);
    if (iVar1 != 0) goto LAB_0010304b;
  }
  puVar2 = (undefined8 *)malloc(0x10);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = handle;
    puVar2[1] = 0;
    uVar4 = function_create("three_str",3,puVar2,function_mock_singleton);
    uVar5 = function_signature(uVar4);
    uVar6 = loader_impl_type(impl,"String");
    signature_set_return(uVar5,uVar6);
    uVar6 = loader_impl_type(impl,"String");
    signature_set(uVar5,0,"a_str",uVar6);
    uVar6 = loader_impl_type(impl,"String");
    signature_set(uVar5,1,"b_str",uVar6);
    uVar6 = loader_impl_type(impl,"String");
    signature_set(uVar5,2,"c_str",uVar6);
    uVar5 = value_create_function(uVar4);
    uVar4 = function_name(uVar4);
    iVar1 = scope_define(uVar3,uVar4,uVar5);
    if (iVar1 != 0) goto LAB_0010304b;
  }
  puVar2 = (undefined8 *)malloc(0x10);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = handle;
    puVar2[1] = 0;
    uVar4 = function_create("my_empty_func_str",0,puVar2,function_mock_singleton);
    uVar5 = function_signature(uVar4);
    uVar6 = loader_impl_type(impl,"String");
    signature_set_return(uVar5,uVar6);
    uVar5 = value_create_function(uVar4);
    uVar4 = function_name(uVar4);
    iVar1 = scope_define(uVar3,uVar4,uVar5);
    if (iVar1 != 0) goto LAB_0010304b;
  }
  puVar2 = (undefined8 *)malloc(0x10);
  if (puVar2 == (undefined8 *)0x0) {
    return 0;
  }
  *puVar2 = handle;
  puVar2[1] = 0;
  uVar4 = function_create("my_empty_func_int",0,puVar2,function_mock_singleton);
  uVar5 = function_signature(uVar4);
  uVar6 = loader_impl_type(impl,"Integer");
  signature_set_return(uVar5,uVar6);
  uVar5 = value_create_function(uVar4);
  uVar4 = function_name(uVar4);
  iVar1 = scope_define(uVar3,uVar4,uVar5);
  if (iVar1 == 0) {
    return 0;
  }
LAB_0010304b:
  value_type_destroy(uVar5);
  return 1;
}

Assistant:

int mock_loader_impl_discover(loader_impl impl, loader_handle handle, context ctx)
{
	loader_impl_mock mock_impl = loader_impl_get(impl);

	loader_impl_mock_handle mock_handle = (loader_impl_mock_handle)handle;

	loader_impl_mock_function mock_function = mock_function_create(mock_handle);

	scope sp = context_scope(ctx);

	(void)mock_impl;

	log_write("metacall", LOG_LEVEL_DEBUG, "Mock module %p discovering", handle);

	if (mock_function != NULL)
	{
		function f = function_create("my_empty_func", 0, mock_function, &function_mock_singleton);

		signature s = function_signature(f);

		signature_set_return(s, loader_impl_type(impl, "Integer"));

		value v = value_create_function(f);

		if (scope_define(sp, function_name(f), v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	mock_function = mock_function_create(mock_handle);

	if (mock_function != NULL)
	{
		function f = function_create("two_doubles", 2, mock_function, &function_mock_singleton);

		signature s = function_signature(f);

		signature_set_return(s, loader_impl_type(impl, "Double"));

		signature_set(s, 0, "first_parameter", loader_impl_type(impl, "Double"));

		signature_set(s, 1, "second_parameter", loader_impl_type(impl, "Double"));

		value v = value_create_function(f);

		if (scope_define(sp, function_name(f), v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	mock_function = mock_function_create(mock_handle);

	if (mock_function != NULL)
	{
		function f = function_create("mixed_args", 5, mock_function, &function_mock_singleton);

		signature s = function_signature(f);

		signature_set_return(s, loader_impl_type(impl, "Char"));

		signature_set(s, 0, "a_char", loader_impl_type(impl, "Char"));

		signature_set(s, 1, "b_int", loader_impl_type(impl, "Integer"));

		signature_set(s, 2, "c_long", loader_impl_type(impl, "Long"));

		signature_set(s, 3, "d_double", loader_impl_type(impl, "Double"));

		signature_set(s, 4, "e_ptr", loader_impl_type(impl, "Ptr"));

		value v = value_create_function(f);

		if (scope_define(sp, function_name(f), v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	mock_function = mock_function_create(mock_handle);

	if (mock_function != NULL)
	{
		function f = function_create("new_args", 1, mock_function, &function_mock_singleton);

		signature s = function_signature(f);

		signature_set_return(s, loader_impl_type(impl, "String"));

		signature_set(s, 0, "a_str", loader_impl_type(impl, "String"));

		value v = value_create_function(f);

		if (scope_define(sp, function_name(f), v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	mock_function = mock_function_create(mock_handle);

	if (mock_function != NULL)
	{
		function f = function_create("two_str", 2, mock_function, &function_mock_singleton);

		signature s = function_signature(f);

		signature_set_return(s, loader_impl_type(impl, "String"));

		signature_set(s, 0, "a_str", loader_impl_type(impl, "String"));

		signature_set(s, 1, "b_str", loader_impl_type(impl, "String"));

		value v = value_create_function(f);

		if (scope_define(sp, function_name(f), v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	mock_function = mock_function_create(mock_handle);

	if (mock_function != NULL)
	{
		function f = function_create("three_str", 3, mock_function, &function_mock_singleton);

		signature s = function_signature(f);

		signature_set_return(s, loader_impl_type(impl, "String"));

		signature_set(s, 0, "a_str", loader_impl_type(impl, "String"));

		signature_set(s, 1, "b_str", loader_impl_type(impl, "String"));

		signature_set(s, 2, "c_str", loader_impl_type(impl, "String"));

		value v = value_create_function(f);

		if (scope_define(sp, function_name(f), v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	mock_function = mock_function_create(mock_handle);

	if (mock_function != NULL)
	{
		function f = function_create("my_empty_func_str", 0, mock_function, &function_mock_singleton);

		signature s = function_signature(f);

		signature_set_return(s, loader_impl_type(impl, "String"));

		value v = value_create_function(f);

		if (scope_define(sp, function_name(f), v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	mock_function = mock_function_create(mock_handle);

	if (mock_function != NULL)
	{
		function f = function_create("my_empty_func_int", 0, mock_function, &function_mock_singleton);

		signature s = function_signature(f);

		signature_set_return(s, loader_impl_type(impl, "Integer"));

		value v = value_create_function(f);

		if (scope_define(sp, function_name(f), v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	return 0;
}